

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_WriteTypedArray(BCWriterState *s,JSValue obj)

{
  int iVar1;
  JSTypedArray *ta;
  JSObject *p;
  uint32_t in_stack_ffffffffffffffbc;
  BCWriterState *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  bc_put_u8(in_stack_ffffffffffffffc0,(uint8_t)(in_stack_ffffffffffffffbc >> 0x18));
  bc_put_u8(in_stack_ffffffffffffffc0,(uint8_t)(in_stack_ffffffffffffffbc >> 0x18));
  bc_put_leb128(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  bc_put_leb128(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  iVar1 = JS_WriteObjectRec(s,obj);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int JS_WriteTypedArray(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    JSTypedArray *ta = p->u.typed_array;

    bc_put_u8(s, BC_TAG_TYPED_ARRAY);
    bc_put_u8(s, p->class_id - JS_CLASS_UINT8C_ARRAY);
    bc_put_leb128(s, p->u.array.count);
    bc_put_leb128(s, ta->offset);
    if (JS_WriteObjectRec(s, JS_MKPTR(JS_TAG_OBJECT, ta->buffer)))
        return -1;
    return 0;
}